

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

Vec_Str_t * Lms_GiaSuppSizes(Gia_Man_t *p)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  Vec_Str_t *p_00;
  Gia_Obj_t *pGVar5;
  Vec_Str_t *p_01;
  ulong uVar6;
  int iVar7;
  
  p_00 = Vec_StrAlloc(p->nObjs);
  Vec_StrPush(p_00,'\0');
  iVar7 = 1;
  do {
    iVar4 = p->nObjs;
    if (iVar4 <= iVar7) {
LAB_002ac91e:
      if (p_00->nSize == iVar4) {
        p_01 = Vec_StrAlloc(p->vCos->nSize);
        iVar7 = 0;
        while ((iVar7 < p->vCos->nSize && (pGVar5 = Gia_ManCo(p,iVar7), pGVar5 != (Gia_Obj_t *)0x0))
              ) {
          iVar4 = Gia_ObjId(p,pGVar5);
          cVar2 = Vec_StrEntry(p_00,iVar4);
          Vec_StrPush(p_01,cVar2);
          iVar7 = iVar7 + 1;
        }
        Vec_StrFree(p_00);
        return p_01;
      }
      __assert_fail("Vec_StrSize(vSupps) == Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,0xe9,"Vec_Str_t *Lms_GiaSuppSizes(Gia_Man_t *)");
    }
    pGVar5 = Gia_ManObj(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) {
      iVar4 = p->nObjs;
      goto LAB_002ac91e;
    }
    uVar3 = (uint)*(ulong *)pGVar5;
    uVar6 = *(ulong *)pGVar5 & 0x1fffffff;
    if (uVar6 == 0x1fffffff || (int)uVar3 < 0) {
      if ((int)uVar3 < 0 && (int)uVar6 != 0x1fffffff) {
        cVar2 = Vec_StrEntry(p_00,iVar7 - (uVar3 & 0x1fffffff));
      }
      else {
        if ((~uVar3 & 0x9fffffff) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                        ,0xe7,"Vec_Str_t *Lms_GiaSuppSizes(Gia_Man_t *)");
        }
        iVar4 = Gia_ObjCioId(pGVar5);
        cVar2 = (char)iVar4 + '\x01';
      }
    }
    else {
      cVar1 = Vec_StrEntry(p_00,iVar7 - (uVar3 & 0x1fffffff));
      cVar2 = Vec_StrEntry(p_00,iVar7 - (*(uint *)&pGVar5->field_0x4 & 0x1fffffff));
      if (cVar2 < cVar1) {
        cVar2 = cVar1;
      }
    }
    Vec_StrPush(p_00,cVar2);
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Vec_Str_t * Lms_GiaSuppSizes( Gia_Man_t * p )
{
    Vec_Str_t * vResult;
    Vec_Str_t * vSupps;
    Gia_Obj_t * pObj;
    int i;
    vSupps = Vec_StrAlloc( Gia_ManObjNum(p) );
    Vec_StrPush( vSupps, 0 );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Vec_StrPush( vSupps, (char)Abc_MaxInt( Vec_StrEntry(vSupps, Gia_ObjFaninId0(pObj, i)), Vec_StrEntry(vSupps, Gia_ObjFaninId1(pObj, i)) ) );
        else if ( Gia_ObjIsCo(pObj) )
            Vec_StrPush( vSupps, Vec_StrEntry(vSupps, Gia_ObjFaninId0(pObj, i)) );
        else if ( Gia_ObjIsCi(pObj) )
            Vec_StrPush( vSupps, (char)(Gia_ObjCioId(pObj)+1) );
        else assert( 0 );
    }
    assert( Vec_StrSize(vSupps) == Gia_ManObjNum(p) );
    vResult = Vec_StrAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_StrPush( vResult, Vec_StrEntry(vSupps, Gia_ObjId(p, pObj)) );
    Vec_StrFree( vSupps );
    return vResult;
}